

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

_Bool Curl_creader_needs_rewind(Curl_easy *data)

{
  Curl_creader *pCVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  _Bool _Var4;
  
  pCVar1 = (data->req).reader_stack;
  while( true ) {
    bVar3 = pCVar1 != (Curl_creader *)0x0;
    if (!bVar3) {
      return bVar3;
    }
    _Var4 = (*pCVar1->crt->needs_rewind)(data,pCVar1);
    if (_Var4) break;
    pCVar1 = pCVar1->next;
  }
  if (data == (Curl_easy *)0x0) {
    return bVar3;
  }
  if (((data->set).field_0x8cd & 0x10) == 0) {
    return bVar3;
  }
  pcVar2 = (data->state).feat;
  if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
    return bVar3;
  }
  if (Curl_trc_feat_read.log_level < 1) {
    return bVar3;
  }
  Curl_trc_read(data,"client reader needs rewind before next request");
  return bVar3;
}

Assistant:

bool Curl_creader_needs_rewind(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  while(reader) {
    if(reader->crt->needs_rewind(data, reader)) {
      CURL_TRC_READ(data, "client reader needs rewind before next request");
      return TRUE;
    }
    reader = reader->next;
  }
  return FALSE;
}